

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOArrayLengthTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOArrayLengthCase::iterate(SSBOArrayLengthCase *this)

{
  ostringstream *poVar1;
  char cVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  int *piVar6;
  TestError *pTVar7;
  char *description;
  undefined1 local_1a8 [16];
  TestLog local_198 [13];
  ios_base local_130 [264];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Allocating float memory buffer with ",0x24);
  std::ostream::operator<<(poVar1,0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," elements.",10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  (**(code **)(lVar5 + 0x40))(0x90d2,this->m_targetBufferID);
  (**(code **)(lVar5 + 0x150))(0x90d2,0x40,0,0x88ea);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"update buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0xc0);
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Running compute shader.",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  (**(code **)(lVar5 + 0x1680))((this->m_shader->m_program).m_program);
  (**(code **)(lVar5 + 0x528))(1,1,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"dispatch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0xc9);
  (**(code **)(lVar5 + 0x40))(0x90d2,this->m_outputBufferID);
  piVar6 = (int *)(**(code **)(lVar5 + 0xd00))(0x90d2,0,4,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"map",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                  ,0xd1);
  if (piVar6 == (int *)0x0) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"mapBufferRange returned NULL","");
    tcu::TestError::TestError(pTVar7,(string *)local_1a8);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = *piVar6;
  if (iVar3 == 0x10) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a8 + 8),"Length returned was correct.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"ERROR: Length returned was ",0x1b);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected ",0xb);
    std::ostream::operator<<(poVar1,0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
  std::ios_base::~ios_base(local_130);
  cVar2 = (**(code **)(lVar5 + 0x1670))(0x90d2);
  if (cVar2 != '\0') {
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"unmap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOArrayLengthTests.cpp"
                    ,0xe1);
    if (iVar3 != 0x10) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar3 != 0x10),
               description);
    return STOP;
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"unmapBuffer returned false","");
  tcu::TestError::TestError(pTVar7,(string *)local_1a8);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

SSBOArrayLengthCase::IterateResult SSBOArrayLengthCase::iterate (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	bool					error	= false;

	// Update buffer size

	m_testCtx.getLog() << tcu::TestLog::Message << "Allocating float memory buffer with " << static_cast<int>(s_fixedBufferSize) << " elements." << tcu::TestLog::EndMessage;

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_targetBufferID);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, s_fixedBufferSize * (int)sizeof(float), DE_NULL, GL_DYNAMIC_COPY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "update buffer");

	// Run compute

	m_testCtx.getLog() << tcu::TestLog::Message << "Running compute shader." << tcu::TestLog::EndMessage;

	gl.useProgram(m_shader->getProgram());
	gl.dispatchCompute(1, 1, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "dispatch");

	// Verify
	{
		const void* ptr;

		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_outputBufferID);
		ptr = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (int)sizeof(deUint32), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "map");

		if (!ptr)
			throw tcu::TestError("mapBufferRange returned NULL");

		if (*(const deUint32*)ptr != (deUint32)s_fixedBufferSize)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Length returned was " << *(const deUint32*)ptr << ", expected " << static_cast<int>(s_fixedBufferSize) << tcu::TestLog::EndMessage;
			error = true;
		}
		else
			m_testCtx.getLog() << tcu::TestLog::Message << "Length returned was correct." << tcu::TestLog::EndMessage;

		if (gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER) == GL_FALSE)
			throw tcu::TestError("unmapBuffer returned false");

		GLU_EXPECT_NO_ERROR(gl.getError(), "unmap");
	}

	if (!error)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	return STOP;
}